

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_column_data.cpp
# Opt level: O1

unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>
__thiscall
duckdb::StandardColumnData::Checkpoint
          (StandardColumnData *this,RowGroup *row_group,ColumnCheckpointInfo *checkpoint_info)

{
  _Head_base<0UL,_duckdb::ColumnCheckpointState_*,_false> _Var1;
  undefined8 uVar2;
  pointer pCVar3;
  type __args;
  StandardColumnCheckpointState *__args_00;
  ColumnCheckpointInfo *in_RCX;
  pointer *__ptr_2;
  pointer *__ptr;
  vector<std::reference_wrapper<duckdb::ColumnCheckpointState>,_true> checkpoint_states;
  unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>
  validity_state_p;
  ColumnDataCheckpointer checkpointer;
  undefined1 local_168 [40];
  LogicalType local_140;
  LogicalType local_128;
  undefined1 local_110 [32];
  LogicalType local_f0 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  _Bit_type *local_88;
  uint local_80;
  _Bit_type *local_78;
  uint local_70;
  _Bit_pointer local_68;
  vector<duckdb::vector<duckdb::optional_ptr<duckdb::CompressionFunction,_true>,_true>,_std::allocator<duckdb::vector<duckdb::optional_ptr<duckdb::CompressionFunction,_true>,_true>_>_>
  local_60;
  vector<duckdb::vector<duckdb::unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>,_true>,_true>_>_>
  local_48;
  
  (**(code **)((row_group->super_SegmentBase<duckdb::RowGroup>).start + 0xd8))();
  LogicalType::LogicalType(&local_128,(LogicalType *)&row_group->owned_version_info);
  BaseStatistics::CreateEmpty((BaseStatistics *)local_110,&local_128);
  BaseStatistics::ToUnique((BaseStatistics *)local_168);
  pCVar3 = unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>
           ::operator->((unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>
                         *)this);
  uVar2 = local_168._0_8_;
  local_168._0_8_ = (BaseStatistics *)0x0;
  ::std::__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>::
  reset((__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_> *)
        &pCVar3->global_stats,(pointer)uVar2);
  uVar2 = local_168._0_8_;
  if ((BaseStatistics *)local_168._0_8_ != (BaseStatistics *)0x0) {
    BaseStatistics::~BaseStatistics((BaseStatistics *)local_168._0_8_);
    operator_delete((void *)uVar2);
  }
  local_168._0_8_ = (pointer)0x0;
  BaseStatistics::~BaseStatistics((BaseStatistics *)local_110);
  LogicalType::~LogicalType(&local_128);
  ColumnData::CreateCheckpointState
            ((ColumnData *)(local_168 + 0x20),
             (RowGroup *)
             &row_group[1].columns.
              super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
              .
              super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish,(PartialBlockManager *)checkpoint_info);
  LogicalType::LogicalType
            (&local_140,
             (LogicalType *)
             &row_group[1].row_group_lock.super___mutex_base._M_mutex.__data.__list.__next);
  BaseStatistics::CreateEmpty((BaseStatistics *)local_110,&local_140);
  BaseStatistics::ToUnique((BaseStatistics *)local_168);
  pCVar3 = unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>
           ::operator->((unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>
                         *)(local_168 + 0x20));
  uVar2 = local_168._0_8_;
  local_168._0_8_ = (BaseStatistics *)0x0;
  ::std::__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>::
  reset((__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_> *)
        &pCVar3->global_stats,(pointer)uVar2);
  uVar2 = local_168._0_8_;
  if ((BaseStatistics *)local_168._0_8_ != (BaseStatistics *)0x0) {
    BaseStatistics::~BaseStatistics((BaseStatistics *)local_168._0_8_);
    operator_delete((void *)uVar2);
  }
  local_168._0_8_ = (pointer)0x0;
  BaseStatistics::~BaseStatistics((BaseStatistics *)local_110);
  LogicalType::~LogicalType(&local_140);
  __args = unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>
           ::operator*((unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>
                        *)(local_168 + 0x20));
  __args_00 = (StandardColumnCheckpointState *)
              unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>
              ::operator->((unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>
                            *)this);
  uVar2 = local_168._32_8_;
  local_168._32_8_ = (long *)0x0;
  _Var1._M_head_impl =
       (__args_00->validity_state).
       super_unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ColumnCheckpointState_*,_std::default_delete<duckdb::ColumnCheckpointState>_>
       .super__Head_base<0UL,_duckdb::ColumnCheckpointState_*,_false>._M_head_impl;
  (__args_00->validity_state).
  super_unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnCheckpointState_*,_std::default_delete<duckdb::ColumnCheckpointState>_>
  .super__Head_base<0UL,_duckdb::ColumnCheckpointState_*,_false>._M_head_impl =
       (ColumnCheckpointState *)uVar2;
  if (_Var1._M_head_impl != (ColumnCheckpointState *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_ColumnCheckpointState + 8))();
  }
  local_110._0_8_ = (long)&(row_group->row_group_lock).super___mutex_base._M_mutex + 0x18;
  local_110[8] = false;
  ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_110);
  local_110[8] = true;
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_110);
  if ((row_group->row_group_lock).super___mutex_base._M_mutex.__align !=
      *(long *)((long)&(row_group->row_group_lock).super___mutex_base._M_mutex + 8)) {
    local_168._0_8_ = (pointer)0x0;
    local_168._8_8_ = (element_type *)0x0;
    local_168._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    ::std::
    vector<std::reference_wrapper<duckdb::ColumnCheckpointState>,std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>>>
    ::_M_realloc_insert<duckdb::StandardColumnCheckpointState&>
              ((vector<std::reference_wrapper<duckdb::ColumnCheckpointState>,std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>>>
                *)local_168,(iterator)0x0,__args_00);
    if (local_168._8_8_ == local_168._16_8_) {
      ::std::
      vector<std::reference_wrapper<duckdb::ColumnCheckpointState>,std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>>>
      ::_M_realloc_insert<duckdb::ColumnCheckpointState&>
                ((vector<std::reference_wrapper<duckdb::ColumnCheckpointState>,std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>>>
                  *)local_168,(iterator)local_168._8_8_,__args);
    }
    else {
      *(ColumnCheckpointState **)local_168._8_8_ = __args;
      local_168._8_8_ = local_168._8_8_ + 8;
    }
    ColumnDataCheckpointer::ColumnDataCheckpointer
              ((ColumnDataCheckpointer *)local_110,
               (vector<std::reference_wrapper<duckdb::ColumnCheckpointState>,_true> *)local_168,
               (DatabaseInstance *)
               ((row_group->collection)._M_data)->block_manager[1].blocks._M_h._M_element_count,
               (RowGroup *)checkpoint_info,in_RCX);
    ColumnDataCheckpointer::Checkpoint((ColumnDataCheckpointer *)local_110);
    ColumnDataCheckpointer::FinalizeCheckpoint((ColumnDataCheckpointer *)local_110);
    ::std::
    vector<duckdb::vector<duckdb::unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>,_true>,_true>_>_>
    ::~vector(&local_48);
    ::std::
    vector<duckdb::vector<duckdb::optional_ptr<duckdb::CompressionFunction,_true>,_true>,_std::allocator<duckdb::vector<duckdb::optional_ptr<duckdb::CompressionFunction,_true>,_true>_>_>
    ::~vector(&local_60);
    if (local_88 != (_Bit_type *)0x0) {
      operator_delete(local_88);
      local_88 = (_Bit_type *)0x0;
      local_80 = 0;
      local_78 = (_Bit_type *)0x0;
      local_70 = 0;
      local_68 = (_Bit_pointer)0x0;
    }
    if (local_98._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98._M_pi);
    }
    if (local_a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a8._M_pi);
    }
    if ((__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics[]>_>)
        local_c0._M_pi !=
        (__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics[]>_>)0x0
       ) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0._M_pi);
    }
    LogicalType::~LogicalType(local_f0);
    if ((pointer)local_168._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_168._0_8_);
    }
  }
  if ((long *)local_168._32_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_168._32_8_ + 8))();
  }
  return (unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>_>
          )(unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>_>
            )this;
}

Assistant:

unique_ptr<ColumnCheckpointState> StandardColumnData::Checkpoint(RowGroup &row_group,
                                                                 ColumnCheckpointInfo &checkpoint_info) {
	// we need to checkpoint the main column data first
	// that is because the checkpointing of the main column data ALSO scans the validity data
	// to prevent reading the validity data immediately after it is checkpointed we first checkpoint the main column
	// this is necessary for concurrent checkpointing as due to the partial block manager checkpointed data might be
	// flushed to disk by a different thread than the one that wrote it, causing a data race
	auto base_state = CreateCheckpointState(row_group, checkpoint_info.info.manager);
	base_state->global_stats = BaseStatistics::CreateEmpty(type).ToUnique();
	auto validity_state_p = validity.CreateCheckpointState(row_group, checkpoint_info.info.manager);
	validity_state_p->global_stats = BaseStatistics::CreateEmpty(validity.type).ToUnique();

	auto &validity_state = *validity_state_p;
	auto &checkpoint_state = base_state->Cast<StandardColumnCheckpointState>();
	checkpoint_state.validity_state = std::move(validity_state_p);

	auto &nodes = data.ReferenceSegments();
	if (nodes.empty()) {
		// empty table: flush the empty list
		return base_state;
	}

	vector<reference<ColumnCheckpointState>> checkpoint_states;
	checkpoint_states.emplace_back(checkpoint_state);
	checkpoint_states.emplace_back(validity_state);

	ColumnDataCheckpointer checkpointer(checkpoint_states, GetDatabase(), row_group, checkpoint_info);
	checkpointer.Checkpoint();
	checkpointer.FinalizeCheckpoint();

	return base_state;
}